

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

result * __thiscall
lest::expression_lhs<nonstd::span_lite::span<int,18446744073709551615ul>const&>::operator==
          (result *__return_storage_ptr__,
          expression_lhs<nonstd::span_lite::span<int,18446744073709551615ul>const&> *this,
          span<int,_18446744073709551615UL> *rhs)

{
  lest *this_00;
  pointer __s1;
  size_type sVar1;
  pointer __s2;
  int iVar2;
  span<int,_18446744073709551615UL> *in_R8;
  bool bVar3;
  string local_70;
  span<int,_18446744073709551615UL> local_50;
  long local_40 [2];
  
  this_00 = *(lest **)this;
  __s1 = *(pointer *)this_00;
  sVar1 = *(size_type *)(this_00 + 8);
  bVar3 = sVar1 == rhs->size_;
  __s2 = rhs->data_;
  if (bVar3 && __s1 != __s2) {
    if (sVar1 == 0) {
      bVar3 = true;
    }
    else {
      iVar2 = bcmp(__s1,__s2,sVar1 << 2);
      bVar3 = iVar2 == 0;
    }
  }
  else {
    bVar3 = bVar3 && __s1 == __s2;
  }
  local_50.data_ = (pointer)local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"==","");
  to_string<nonstd::span_lite::span<int,18446744073709551615ul>,nonstd::span_lite::span<int,18446744073709551615ul>>
            (&local_70,this_00,&local_50,(string *)rhs,in_R8);
  __return_storage_ptr__->passed = bVar3;
  (__return_storage_ptr__->decomposition)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->decomposition).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->decomposition,local_70._M_dataplus._M_p,
             local_70._M_dataplus._M_p + local_70._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((long *)local_50.data_ != local_40) {
    operator_delete(local_50.data_,local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

result operator< ( R const & rhs ) { return result( lhs <  rhs, to_string( lhs, "<" , rhs ) ); }